

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::valueToString_abi_cxx11_(LargestInt value)

{
  char *pcVar1;
  LargestUInt in_RSI;
  string *in_RDI;
  bool isNegative;
  char *current;
  UIntToStringBuffer buffer;
  allocator local_42;
  byte local_41;
  char *local_40;
  char local_38 [25];
  char acStack_1f [15];
  LargestUInt local_10;
  
  local_40 = acStack_1f;
  local_41 = (long)in_RSI < 0;
  local_10 = in_RSI;
  if ((bool)local_41) {
    local_10 = -in_RSI;
  }
  uintToString(local_10,&local_40);
  if ((local_41 & 1) != 0) {
    pcVar1 = local_40 + -1;
    local_40 = local_40 + -1;
    *pcVar1 = '-';
  }
  pcVar1 = local_40;
  if (local_38 <= local_40) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_42);
    std::allocator<char>::~allocator((allocator<char> *)&local_42);
    return in_RDI;
  }
  __assert_fail("current >= buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                ,0x4c,"std::string Json::valueToString(LargestInt)");
}

Assistant:

std::string valueToString(LargestInt value) {
  UIntToStringBuffer buffer;
  char* current = buffer + sizeof(buffer);
  bool isNegative = value < 0;
  if (isNegative)
    value = -value;
  uintToString(LargestUInt(value), current);
  if (isNegative)
    *--current = '-';
  assert(current >= buffer);
  return current;
}